

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

Ptr __thiscall
r_comp::Preprocessor::process(Preprocessor *this,char *file,string *error,Metadata *metadata)

{
  int64_t iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Metadata *in_R8;
  Ptr PVar2;
  string sStack_268;
  uint64_t b;
  uint64_t a;
  ifstream stream;
  byte abStack_218 [488];
  
  std::__cxx11::string::assign((char *)&RepliStruct::GlobalFilename_abi_cxx11_);
  std::ifstream::ifstream(&stream,(char *)error,_S_in);
  if (*(int *)(abStack_218 + *(long *)(_stream + -0x18)) == 0) {
    RepliStruct::reset(*(RepliStruct **)file);
    std::__cxx11::string::assign((char *)(*(long *)file + 0x88));
    a = 0;
    b = 0;
    iVar1 = RepliStruct::parse(*(RepliStruct **)file,(istream *)&stream,&a,&b,0);
    if (iVar1 < 0) {
      RepliStruct::printError_abi_cxx11_(&sStack_268,*(RepliStruct **)file);
      std::__cxx11::string::operator=((string *)metadata,(string *)&sStack_268);
      std::__cxx11::string::~string((string *)&sStack_268);
      std::ifstream::close();
    }
    else if ((abStack_218[*(long *)(_stream + -0x18)] & 2) == 0) {
      std::__cxx11::string::assign((char *)metadata);
      std::ifstream::close();
    }
    else {
      do {
        iVar1 = RepliStruct::process(*(RepliStruct **)file);
      } while (0 < iVar1);
      if (iVar1 < 0) {
        RepliStruct::printError_abi_cxx11_(&sStack_268,*(RepliStruct **)file);
        std::__cxx11::string::operator=((string *)metadata,(string *)&sStack_268);
        std::__cxx11::string::~string((string *)&sStack_268);
        std::ifstream::close();
      }
      else {
        if (in_R8 != (Metadata *)0x0) {
          initialize((Preprocessor *)file,in_R8);
        }
        RepliStruct::printError_abi_cxx11_(&sStack_268,*(RepliStruct **)file);
        std::__cxx11::string::operator=((string *)metadata,(string *)&sStack_268);
        std::__cxx11::string::~string((string *)&sStack_268);
        std::ifstream::close();
        if ((metadata->classes)._M_h._M_bucket_count == 0) {
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)this,
                     (__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)file);
          goto LAB_0013fa3b;
        }
      }
    }
  }
  else {
    std::__cxx11::string::assign((char *)metadata);
    std::__cxx11::string::append((char *)metadata);
  }
  (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0013fa3b:
  std::ifstream::~ifstream(&stream);
  PVar2.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar2.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

RepliStruct::Ptr Preprocessor::process(const char* file, std::string& error, r_comp::Metadata* metadata)
{
    RepliStruct::GlobalFilename = file;
    std::ifstream stream(file);

    if (!stream.good()) {
        error = "unable to load file ";
        error += file;
        return nullptr;
    }

    root->reset(); // trims root from previously preprocessed objects.
    root->fileName = file;
    uint64_t a = 0, b = 0;

    if (root->parse(&stream, a, b) < 0) {
        error = root->printError();
        stream.close();
        return nullptr;
    }

    if (!stream.eof()) {
        error = "Code structure error: Unexpected EOF, unmatched ) or ].\n";
        stream.close();
        return nullptr;
    }

    int64_t pass = 0, total = 0, count;

    while ((count = root->process()) > 0) {
        total += count;
        pass++;
    }

    if (count < 0) {
        error = root->printError();
        stream.close();
        return nullptr;
    }

    if (metadata) {
        initialize(metadata);
    }

    error = root->printError();
    stream.close();

    if (error.size() > 0) {
        return nullptr;
    }

    return root;
}